

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::negative_binomial_dist_&,_const_trng::negative_binomial_dist_&> * __thiscall
Catch::ExprLhs<trng::negative_binomial_dist_const&>::operator==
          (BinaryExpr<const_trng::negative_binomial_dist_&,_const_trng::negative_binomial_dist_&>
           *__return_storage_ptr__,ExprLhs<trng::negative_binomial_dist_const&> *this,
          negative_binomial_dist *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  negative_binomial_dist *pnVar5;
  StringRef local_38;
  
  pnVar5 = *(negative_binomial_dist **)this;
  dVar1 = (pnVar5->P).r_;
  dVar2 = (rhs->P).r_;
  dVar3 = (rhs->P).p_;
  dVar4 = (pnVar5->P).p_;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result =
       (bool)(-(dVar2 == dVar1) & -(dVar4 == dVar3) & 1);
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002ea478;
  __return_storage_ptr__->m_lhs = pnVar5;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }